

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.c
# Opt level: O0

bool_t UpperPath(tchar_t *Path,tchar_t *Last,size_t LastLen)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  tchar_t local_68 [8];
  tchar_t Mime [32];
  bool_t HasHost;
  tchar_t *c;
  tchar_t *b;
  tchar_t *a;
  size_t LastLen_local;
  tchar_t *Last_local;
  tchar_t *Path_local;
  
  if (*Path == '\0') {
    return 0;
  }
  RemovePathDelimiter(Path);
  HasHost = (bool_t)GetProtocol(Path,local_68,0x20,(bool_t *)(Mime + 0x18));
  b = strrchr((char *)HasHost,0x5c);
  pcVar2 = strrchr((char *)HasHost,0x2f);
  if ((b == (char *)0x0) || ((pcVar2 != (char *)0x0 && (b < pcVar2)))) {
    b = pcVar2;
  }
  if (b == (tchar_t *)0x0) {
    iVar1 = tcsicmp(local_68,"smb");
    if (iVar1 == 0) {
      *(tchar_t *)HasHost = '\0';
      tcscpy_s(Last,LastLen,Path);
      return 1;
    }
    if ((Mime._24_8_ != 0) && (iVar1 = tcsicmp(local_68,"upnp"), iVar1 != 0)) {
      return 0;
    }
    b = (tchar_t *)HasHost;
    if (*(char *)HasHost == '\0') {
      HasHost = (bool_t)Path;
      b = Path;
    }
  }
  else {
    b = b + 1;
  }
  if (Last != (tchar_t *)0x0) {
    tcscpy_s(Last,LastLen,b);
  }
  if (b == (tchar_t *)HasHost) {
    *b = '\0';
  }
  while( true ) {
    b = b + -1;
    bVar3 = false;
    if (((ulong)HasHost <= b) && (bVar3 = true, *b != '\\')) {
      bVar3 = *b == '/';
    }
    if (!bVar3) break;
    *b = '\0';
  }
  return 1;
}

Assistant:

bool_t UpperPath(tchar_t* Path, tchar_t* Last, size_t LastLen)
{
    tchar_t *a,*b,*c;
    bool_t HasHost;
    tchar_t Mime[32];

    if (!*Path)
        return 0;

    RemovePathDelimiter(Path);
    c = (tchar_t*)GetProtocol(Path,Mime,TSIZEOF(Mime),&HasHost);

    a = tcsrchr(c,'\\');
    b = tcsrchr(c,'/');
    if (!a || (b && b>a))
        a=b;

    if (!a)
    {
        if (tcsicmp(Mime, T("smb")) == 0) {
            *c = 0;
            tcscpy_s(Last, LastLen, Path);
            return 1;
        }

        if (HasHost && tcsicmp(Mime, T("upnp"))!=0)
            return 0;
        a=c;
        if (!a[0]) // only mime left
            a=c=Path;
    }
    else
        ++a;

    if (Last)
        tcscpy_s(Last,LastLen,a);

    if (a==c)
        *a = 0;

    while (--a>=c && (*a=='\\' || *a=='/'))
        *a = 0;

    return 1;
}